

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O1

CodeLocation __thiscall
soul::SourceCodeUtilities::findNextOccurrence
          (SourceCodeUtilities *this,CodeLocation *start,char character)

{
  UnicodeChar UVar1;
  UTF8Reader extraout_RDX;
  CodeLocation CVar2;
  CodeLocation pos;
  SourceCodeText *local_28;
  UTF8Reader local_20;
  
  local_28 = (start->sourceCode).object;
  if (local_28 != (SourceCodeText *)0x0) {
    (local_28->super_RefCountedObject).refCount = (local_28->super_RefCountedObject).refCount + 1;
  }
  local_20.data = (start->location).data;
  do {
    UVar1 = UTF8Reader::operator*(&local_20);
    if (UVar1 == (int)character) {
      *(SourceCodeText **)this = local_28;
      local_28 = (SourceCodeText *)0x0;
      *(char **)(this + 8) = local_20.data;
LAB_001cfdaa:
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_28);
      CVar2.location.data = extraout_RDX.data;
      CVar2.sourceCode.object = (SourceCodeText *)this;
      return CVar2;
    }
    if (UVar1 == 0) {
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
      goto LAB_001cfdaa;
    }
    UTF8Reader::operator++(&local_20);
  } while( true );
}

Assistant:

CodeLocation SourceCodeUtilities::findNextOccurrence (CodeLocation start, char character)
{
    for (auto pos = start;; ++(pos.location))
    {
        auto c = *(pos.location);

        if (c == static_cast<decltype(c)> (character))
            return pos;

        if (c == 0)
            return {};
    }
}